

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::TestHugeFieldNumbersLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  _func_int **pp_Var6;
  MessageLite *pMVar7;
  MessageLite *pMVar8;
  char *failure_msg;
  void *pvVar9;
  TestAllTypesLite *pTVar10;
  int line;
  Arena *pAVar11;
  string *value;
  Arena *arena;
  TestHugeFieldNumbersLite *_this;
  TestHugeFieldNumbersLite *local_38;
  LogMessageFatal local_30;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_38 = (TestHugeFieldNumbersLite *)to_msg;
  local_30.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::TestHugeFieldNumbersLite_const*,proto2_unittest::TestHugeFieldNumbersLite*>
                          ((TestHugeFieldNumbersLite **)&local_30,&local_38,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x2afe;
LAB_0018de2a:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_38->field_0)._impl_.repeated_int32_,(RepeatedField<int> *)(from_msg + 3));
  google::protobuf::RepeatedField<int>::MergeFrom
            (&(local_38->field_0)._impl_.packed_int32_,(RepeatedField<int> *)(from_msg + 4));
  google::protobuf::internal::MapMergeFrom<std::__cxx11::string,std::__cxx11::string>
            ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&(local_38->field_0)._impl_.string_string_map_,
             (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&from_msg[5]._internal_metadata_);
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar2 & 0x7f) != 0) {
    if ((uVar2 & 1) != 0) {
      uVar5 = from_msg[7]._internal_metadata_.ptr_;
      pHVar1 = &(local_38->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 1;
      pAVar11 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.optional_string_,(string *)(uVar5 & 0xfffffffffffffffc)
                 ,pAVar11);
    }
    if ((uVar2 & 2) != 0) {
      pp_Var6 = from_msg[8]._vptr_MessageLite;
      pHVar1 = &(local_38->field_0)._impl_._has_bits_;
      pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | 2;
      pAVar11 = (Arena *)(local_38->super_MessageLite)._internal_metadata_.ptr_;
      if (((ulong)pAVar11 & 1) != 0) {
        pAVar11 = *(Arena **)((ulong)pAVar11 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                (&(local_38->field_0)._impl_.optional_bytes_,
                 (string *)((ulong)pp_Var6 & 0xfffffffffffffffc),pAVar11);
    }
    if ((uVar2 & 4) != 0) {
      pMVar7 = (MessageLite *)from_msg[8]._internal_metadata_.ptr_;
      if (pMVar7 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optional_message_ != nullptr";
        line = 0x2b0e;
        goto LAB_0018de2a;
      }
      pMVar8 = *(MessageLite **)((long)&local_38->field_0 + 0x78);
      if (pMVar8 == (MessageLite *)0x0) {
        pvVar9 = google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessageLite>
                           (arena,pMVar7);
        *(void **)((long)&local_38->field_0 + 0x78) = pvVar9;
      }
      else {
        ForeignMessageLite::MergeImpl(pMVar8,pMVar7);
      }
    }
    if ((uVar2 & 8) != 0) {
      pMVar7 = (MessageLite *)from_msg[9]._vptr_MessageLite;
      if (pMVar7 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.optionalgroup_ != nullptr";
        line = 0x2b16;
        goto LAB_0018de2a;
      }
      pMVar8 = *(MessageLite **)((long)&local_38->field_0 + 0x80);
      if (pMVar8 == (MessageLite *)0x0) {
        pvVar9 = google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestHugeFieldNumbersLite_OptionalGroup>
                           (arena,pMVar7);
        *(void **)((long)&local_38->field_0 + 0x80) = pvVar9;
      }
      else {
        TestHugeFieldNumbersLite_OptionalGroup::MergeImpl(pMVar8,pMVar7);
      }
    }
    if ((uVar2 & 0x10) != 0) {
      *(int *)((long)&local_38->field_0 + 0x88) = (int)from_msg[9]._internal_metadata_.ptr_;
    }
    if ((uVar2 & 0x20) != 0) {
      (local_38->field_0)._impl_.fixed_32_ =
           *(int32_t *)((long)&from_msg[9]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar2 & 0x40) != 0) {
      *(undefined4 *)((long)&local_38->field_0 + 0x90) =
           *(undefined4 *)&from_msg[10]._vptr_MessageLite;
    }
  }
  pHVar1 = &(local_38->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  uVar3 = *(uint32_t *)&from_msg[0xb]._vptr_MessageLite;
  if (uVar3 == 0) goto switchD_0018dce9_default;
  uVar4 = (local_38->field_0)._impl_._oneof_case_[0];
  if (uVar4 != uVar3) {
    if (uVar4 != 0) {
      clear_oneof_field(local_38);
    }
    (local_38->field_0)._impl_._oneof_case_[0] = uVar3;
  }
  switch(uVar3) {
  case 0x1ffffc7b:
    *(int *)((long)&local_38->field_0 + 0x98) = (int)from_msg[10]._internal_metadata_.ptr_;
    break;
  case 0x1ffffc7c:
    if (uVar4 == uVar3) {
      TestAllTypesLite::MergeImpl
                (&((local_38->field_0)._impl_.oneof_field_.oneof_test_all_types_)->super_MessageLite
                 ,(MessageLite *)from_msg[10]._internal_metadata_.ptr_);
    }
    else {
      pTVar10 = (TestAllTypesLite *)
                google::protobuf::Arena::CopyConstruct<proto2_unittest::TestAllTypesLite>
                          (arena,(void *)from_msg[10]._internal_metadata_.ptr_);
      (local_38->field_0)._impl_.oneof_field_.oneof_test_all_types_ = pTVar10;
    }
    break;
  case 0x1ffffc7d:
    if (uVar4 != uVar3) {
      (local_38->field_0)._impl_.oneof_field_.oneof_test_all_types_ =
           (TestAllTypesLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0xb]._vptr_MessageLite == 0x1ffffc7d) goto LAB_0018dd4e;
LAB_0018dd1f:
    value = (string *)&google::protobuf::internal::fixed_address_empty_string;
    goto LAB_0018dd59;
  case 0x1ffffc7e:
    if (uVar4 != uVar3) {
      (local_38->field_0)._impl_.oneof_field_.oneof_test_all_types_ =
           (TestAllTypesLite *)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0xb]._vptr_MessageLite != 0x1ffffc7e) goto LAB_0018dd1f;
LAB_0018dd4e:
    value = (string *)(from_msg[10]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
LAB_0018dd59:
    google::protobuf::internal::ArenaStringPtr::Set<>
              (&(local_38->field_0)._impl_.oneof_field_.oneof_string_,value,arena);
  }
switchD_0018dce9_default:
  google::protobuf::internal::ExtensionSet::MergeFrom
            (&(local_38->field_0)._impl_._extensions_,
             (MessageLite *)_TestHugeFieldNumbersLite_default_instance_,
             (ExtensionSet *)(from_msg + 1));
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(local_38->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestHugeFieldNumbersLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestHugeFieldNumbersLite*>(&to_msg);
  auto& from = static_cast<const TestHugeFieldNumbersLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestHugeFieldNumbersLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_packed_int32()->MergeFrom(from._internal_packed_int32());
  _this->_impl_.string_string_map_.MergeFrom(from._impl_.string_string_map_);
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.optional_message_ != nullptr);
      if (_this->_impl_.optional_message_ == nullptr) {
        _this->_impl_.optional_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_message_);
      } else {
        _this->_impl_.optional_message_->MergeFrom(*from._impl_.optional_message_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.fixed_32_ = from._impl_.fixed_32_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.optional_enum_ = from._impl_.optional_enum_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofTestAllTypes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_test_all_types_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_test_all_types_);
        } else {
          _this->_impl_.oneof_field_.oneof_test_all_types_->MergeFrom(*from._impl_.oneof_field_.oneof_test_all_types_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}